

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void thread_main(void *arg)

{
  ssize_t sVar1;
  int iVar2;
  int64_t eval_b;
  int64_t eval_a;
  uv_buf_t local_1208;
  uv_fs_t req;
  char buf [4096];
  
  local_1208 = uv_buf_init(buf,0x1000);
  uv_barrier_wait((uv_barrier_t *)arg);
  uv_sleep(100);
  do {
    do {
      iVar2 = uv_fs_read((uv_loop_t *)0x0,&req,*(uv_os_fd_t *)((long)arg + 0x20),&local_1208,1,-1,
                         (uv_fs_cb)0x0);
      sVar1 = req.result;
      uv_fs_req_cleanup(&req);
    } while (0 < sVar1);
  } while ((sVar1 == -1) && (iVar2 == -4));
  if (sVar1 == 0) {
    return;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-set-non-blocking.c"
          ,0x31,"n","==","0",sVar1,"==",0);
  abort();
}

Assistant:

static void thread_main(void* arg) {
  const struct thread_ctx* ctx;
  int size;
  char* data;

  ctx = (struct thread_ctx*)arg;
  size = ctx->size;
  data = ctx->data;

  while (size > 0) {
    ssize_t result;
    int nbytes;
    nbytes = size < ctx->interval ? size : ctx->interval;
    if (ctx->doread) {
      result = write(ctx->fd, data, nbytes);
      /* Should not see EINTR (or other errors) */
      ASSERT_EQ(result, nbytes);
    } else {
      result = read(ctx->fd, data, nbytes);
      /* Should not see EINTR (or other errors),
       * but might get a partial read if we are faster than the writer
       */
      ASSERT(result > 0 && result <= nbytes);
    }

    pthread_kill(ctx->pid, SIGUSR1);
    size -= result;
    data += result;
  }
}